

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2cpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  char *pcVar7;
  ListType LVar8;
  char *pcVar9;
  allocator<char> local_139;
  OutputList local_138;
  string arg;
  string local_f0;
  string arg_chk;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc == 3) {
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_138._17_8_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_chk,argv[2],(allocator<char> *)&arg);
    if ((1 < arg_chk._M_string_length) && (arg_chk._M_dataplus._M_p[1] == 'p')) {
      local_138.skip_lines = true;
    }
    bVar4 = lst::OutputList::addStream(&local_138,(istream *)&std::cin);
    if (!bVar4) goto LAB_00102821;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[2],(allocator<char> *)&local_f0);
    LVar8 = CHAR;
    if (*arg._M_dataplus._M_p != 'c') {
      LVar8 = (uint)(*arg._M_dataplus._M_p != 's') * 2;
    }
    if (1 < arg._M_string_length) {
      if (arg._M_dataplus._M_p[1] == 'g') {
        bVar4 = true;
      }
      else {
        if (arg._M_dataplus._M_p[1] != 'l') goto LAB_00102788;
        bVar4 = false;
      }
      lst::OutputList::sort(&local_138,bVar4);
    }
LAB_00102788:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,argv[1],&local_139);
    bVar4 = lst::OutputList::validName(&local_138,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (!bVar4) {
      std::operator<<((ostream *)&std::cerr,
                      "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n"
                     );
LAB_00102938:
      exit(1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,argv[1],(allocator<char> *)&local_f0);
    bVar4 = lst::OutputList::outputToFile(&local_138,(ostream *)&std::cout,&local_b0,LVar8);
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar4) {
      std::operator<<((ostream *)&std::cout,"Failed to output stream...\n");
    }
  }
  else {
    if (argc != 5) {
      poVar6 = std::operator<<((ostream *)&std::cerr,*argv);
      poVar6 = std::operator<<(poVar6,
                               ": Requires 4 arguments file output varname type (c or s or b)\n Or requires two arguments and reads from stdin and prints to stdout\n$ "
                              );
      poVar6 = std::operator<<(poVar6,*argv);
      poVar6 = std::operator<<(poVar6," sourcefile outputfile variablename s\n$ cat sourcefile | ");
      poVar6 = std::operator<<(poVar6,*argv);
      poVar6 = std::operator<<(poVar6,
                               " varname s\nTo use greater than sorting add a g type variable:\n$ ")
      ;
      poVar6 = std::operator<<(poVar6,*argv);
      poVar6 = std::operator<<(poVar6," inputfile outputfile varname cg\n");
      poVar6 = std::operator<<(poVar6,"For less than add l to type variable like this:\n$ ");
      poVar6 = std::operator<<(poVar6,*argv);
      std::operator<<(poVar6," inputfile outputfile varname sl\n");
      goto LAB_00102938;
    }
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_138._17_8_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_138.items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_chk,argv[2],(allocator<char> *)&arg);
    if ((1 < arg_chk._M_string_length) && (arg_chk._M_dataplus._M_p[1] == 'p')) {
      local_138.skip_lines = true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,argv[1],(allocator<char> *)&arg);
    bVar4 = lst::OutputList::addFile(&local_138,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar4) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error could not load list from text file: ");
      poVar6 = std::operator<<(poVar6,argv[1]);
      std::operator<<(poVar6,"\n");
      goto LAB_00102938;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[4],(allocator<char> *)&local_f0);
    if (*argv[4] == 'b') {
      LVar8 = BINARY;
      bVar3 = true;
      bVar2 = false;
      bVar4 = false;
    }
    else if (*argv[4] == 's') {
      bVar4 = false;
      bVar2 = true;
      bVar3 = false;
      LVar8 = STRING;
    }
    else {
      LVar8 = CHAR;
      bVar2 = false;
      bVar4 = true;
      bVar3 = false;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,argv[3],&local_139);
    bVar5 = lst::OutputList::validName(&local_138,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (!bVar5) {
      std::operator<<((ostream *)&std::cerr,
                      "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n"
                     );
      goto LAB_00102938;
    }
    if (1 < arg._M_string_length) {
      cVar1 = arg._M_dataplus._M_p[1];
      if (cVar1 == 'g') {
        bVar5 = true;
LAB_001025d2:
        lst::OutputList::sort(&local_138,bVar5);
      }
      else if (cVar1 == 'p') {
        local_138.skip_lines = true;
      }
      else if (cVar1 == 'l') {
        bVar5 = false;
        goto LAB_001025d2;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,argv[2],(allocator<char> *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[3],&local_139);
    bVar5 = lst::OutputList::outputToFile(&local_138,&local_70,&local_90,LVar8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar5) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Sucessfully output list to: ");
      poVar6 = std::operator<<(poVar6,argv[2]);
      std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<((ostream *)&std::cout,"Input: ");
      poVar6 = std::operator<<(poVar6,argv[1]);
      std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<((ostream *)&std::cout,"Output: ");
      poVar6 = std::operator<<(poVar6,argv[2]);
      std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<((ostream *)&std::cout,"Variables: ");
      poVar6 = std::operator<<(poVar6,argv[3]);
      poVar6 = std::operator<<(poVar6,"_arr and ");
      poVar6 = std::operator<<(poVar6,argv[3]);
      poVar6 = std::operator<<(poVar6,"_size");
      std::operator<<(poVar6,"\n");
      pcVar7 = "Varaible type: char array[]\n";
      if (bVar4) {
        pcVar7 = "Variable type: const char *\n";
      }
      pcVar9 = "Varaible type: std::string\n";
      if (!bVar2) {
        pcVar9 = pcVar7;
      }
      if ((!bVar3 && !bVar4) && !bVar2) goto LAB_00102817;
    }
    else {
      pcVar9 = "Encountered an error..\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar9);
  }
LAB_00102817:
  std::__cxx11::string::~string((string *)&arg);
LAB_00102821:
  std::__cxx11::string::~string((string *)&arg_chk);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138.items);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    if(argc !=3 && argc != 5) {
        std::cerr << argv[0] << ": Requires 4 arguments file output varname type (c or s or b)\n Or requires two arguments and reads from stdin and prints to stdout\n$ " << argv[0] << " sourcefile outputfile variablename s\n$ cat sourcefile | " << argv[0] << " varname s\nTo use greater than sorting add a g type variable:\n$ " << argv[0] << " inputfile outputfile varname cg\n" << "For less than add l to type variable like this:\n$ " << argv[0] << " inputfile outputfile varname sl\n";
        exit(EXIT_FAILURE);
    }
    if(argc == 5) {
        lst::OutputList str_list;
        str_list.setSkip(false);
        std::string arg_chk = argv[2];
        if(arg_chk.length()>1 && arg_chk[1] == 'p')
            str_list.setSkip(true);
        if(str_list.addFile(argv[1])) {
            lst::ListType listvar;
            std::string arg = argv[4];
            if(argv[4][0] == 'c')
                listvar = lst::ListType::CHAR;
            else if(argv[4][0] == 'b')
                listvar = lst::ListType::BINARY;
            else if(argv[4][0] == 's')
                listvar = lst::ListType::STRING;
            
            if(str_list.validName(argv[3]) == false) {
                std::cerr << "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n";
                exit(EXIT_FAILURE);
            }

            if(arg.length() > 1 && arg[1] == 'g')
                str_list.sort(true);
            else if(arg.length() > 1 && arg[1] == 'l')
                str_list.sort(false);
            else if(arg.length() > 1 && arg[1] == 'p')
                str_list.setSkip(true);
            
            if(str_list.outputToFile(argv[2],argv[3], listvar)) {
                std::cout << "Sucessfully output list to: " << argv[2] << "\n";
                std::cout << "Input: " << argv[1] << "\n";
                std::cout << "Output: " << argv[2] << "\n";
                std::cout << "Variables: " << argv[3] << "_arr and " << argv[3] << "_size"<< "\n";
                if(listvar == lst::ListType::STRING) {
                    std::cout << "Varaible type: std::string\n";
                } else if(listvar == lst::ListType::CHAR) {
                    std::cout << "Variable type: const char *\n";
                } else if(listvar == lst::ListType::BINARY) {
                    std::cout << "Varaible type: char array[]\n";
                }
            } else {
                std::cout << "Encountered an error..\n";
            }
        } else {
            std::cerr << "Error could not load list from text file: " << argv[1] << "\n";
            exit(EXIT_FAILURE);
        }
    } else if(argc == 3) {
        lst::OutputList str_list;
        str_list.setSkip(false);
        std::string arg_chk = argv[2];
        if(arg_chk.length()>1 && arg_chk[1] == 'p')
            str_list.setSkip(true);
        
        
        if(str_list.addStream(std::cin)) {
            lst::ListType listvar;
            
            std::string arg = argv[2];
            if(arg[0] == 'c')
                listvar = lst::ListType::CHAR;
            else if(arg[0] == 's')
                listvar = lst::ListType::STRING;
            else if(arg[0] == 'b')
                listvar = lst::ListType::BINARY;
            
            if(arg.length() > 1 && arg[1] == 'g')
                str_list.sort(true);
            else if(arg.length() > 1 && arg[1] == 'l')
                str_list.sort(false);
          
            
            
            if(str_list.validName(argv[1]) == false) {
                std::cerr << "Invalid variable name, must start with a letter and only contain digits and alpha characters.\n";
                exit(EXIT_FAILURE);
            }
            
            if(str_list.outputToFile(std::cout,argv[1], listvar) == false) {
                std::cout << "Failed to output stream...\n";
            }
        }
    }
    return 0;
}